

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O3

void __thiscall
duckdb::StandardBufferManager::BatchRead
          (StandardBufferManager *this,
          vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_true> *handles,
          map<long,_unsigned_long,_std::less<long>,_std::allocator<std::pair<const_long,_unsigned_long>_>_>
          *load_map,block_id_t first_block,block_id_t last_block)

{
  MemoryTag tag;
  BlockManager *pBVar1;
  StringUtil *this_00;
  data_ptr_t pdVar2;
  _Base_ptr p_Var3;
  reference pvVar4;
  BlockHandle *pBVar5;
  idx_t iVar6;
  idx_t iVar7;
  FileBuffer *pFVar8;
  long lVar9;
  _Base_ptr multiplier;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  unsigned_long val;
  BlockLock lock;
  BufferHandle buf;
  BufferHandle intermediate_buffer;
  TempBufferPoolReservation reservation;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> local_128;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> local_120;
  unique_lock<std::mutex> local_118;
  block_id_t local_108;
  _Base_ptr local_100;
  unsigned_long local_f8;
  optional_idx *local_f0;
  _Base_ptr local_e8;
  unsigned_long local_e0;
  StandardBufferManager *local_d8;
  vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_true> *local_d0;
  BufferHandle local_c8;
  BufferHandle local_b0;
  string local_98;
  BufferPoolReservation local_78;
  BufferPoolReservation local_60;
  BufferHandle local_48;
  
  local_100 = (_Base_ptr)load_map;
  local_d0 = handles;
  pvVar4 = vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_true>::operator[](handles,0);
  pBVar5 = shared_ptr<duckdb::BlockHandle,_true>::operator->(pvVar4);
  pBVar1 = pBVar5->block_manager;
  local_108 = first_block;
  local_e0 = NumericCastImpl<unsigned_long,_long,_false>::Convert((last_block - first_block) + 1);
  if (local_e0 != 1) {
    local_f0 = &pBVar1->block_alloc_size;
    iVar6 = optional_idx::GetIndex(local_f0);
    iVar7 = optional_idx::GetIndex(&pBVar1->block_header_size);
    local_d8 = this;
    Allocate(&local_b0,this,BASE_TABLE,(iVar6 - iVar7) * local_e0,true);
    pFVar8 = BufferHandle::GetFileBuffer(&local_b0);
    (*pBVar1->_vptr_BlockManager[0xd])(pBVar1,pFVar8,local_108,local_e0);
    if (local_e0 != 0) {
      local_e8 = (_Base_ptr)&local_100->_M_parent;
      val = 0;
      do {
        p_Var3 = local_e8;
        local_f8 = val;
        lVar9 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
        p_Var10 = local_100->_M_left;
        multiplier = local_100;
        p_Var11 = p_Var3;
        if (p_Var10 != (_Base_ptr)0x0) {
          lVar9 = lVar9 + local_108;
          multiplier = p_Var3;
          do {
            if (lVar9 <= (long)*(_Base_ptr *)(p_Var10 + 1)) {
              multiplier = p_Var10;
            }
            p_Var10 = (&p_Var10->_M_left)[(long)*(_Base_ptr *)(p_Var10 + 1) < lVar9];
          } while (p_Var10 != (_Base_ptr)0x0);
          if ((multiplier != p_Var3) &&
             (p_Var11 = multiplier, lVar9 < (long)*(_Base_ptr *)(multiplier + 1))) {
            multiplier = p_Var3;
            p_Var11 = p_Var3;
          }
        }
        pvVar4 = vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_true>::operator[]
                           (local_d0,(size_type)p_Var11[1]._M_parent);
        pBVar5 = shared_ptr<duckdb::BlockHandle,_true>::operator->(pvVar4);
        this_00 = (StringUtil *)(pBVar5->memory_usage).super___atomic_base<unsigned_long>._M_i;
        local_120._M_head_impl = (FileBuffer *)0x0;
        pBVar5 = shared_ptr<duckdb::BlockHandle,_true>::operator->(pvVar4);
        tag = pBVar5->tag;
        StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_98,this_00,0x400,(idx_t)multiplier)
        ;
        EvictBlocksOrThrow<char_const*,std::__cxx11::string>
                  ((TempBufferPoolReservation *)&local_60,local_d8,tag,(idx_t)this_00,
                   (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)
                   &local_120,"failed to pin block of size %s%s",&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        BufferHandle::BufferHandle(&local_c8);
        pBVar5 = shared_ptr<duckdb::BlockHandle,_true>::operator->(pvVar4);
        local_118._M_device = &pBVar5->lock;
        local_118._M_owns = false;
        ::std::unique_lock<std::mutex>::lock(&local_118);
        local_118._M_owns = true;
        pBVar5 = shared_ptr<duckdb::BlockHandle,_true>::operator->(pvVar4);
        if ((pBVar5->state)._M_i == BLOCK_LOADED) {
          BufferPoolReservation::Resize(&local_60,0);
        }
        else {
          pFVar8 = BufferHandle::GetFileBuffer(&local_b0);
          pdVar2 = pFVar8->internal_buffer;
          iVar6 = optional_idx::GetIndex(local_f0);
          pBVar5 = shared_ptr<duckdb::BlockHandle,_true>::operator->(pvVar4);
          lVar9 = iVar6 * local_f8;
          local_128._M_head_impl = local_120._M_head_impl;
          local_120._M_head_impl = (FileBuffer *)0x0;
          BufferPoolReservation::BufferPoolReservation(&local_78,&local_60);
          BlockHandle::LoadFromBuffer
                    (&local_48,pBVar5,&local_118,pdVar2 + lVar9,
                     (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>
                      *)&local_128,&local_78);
          BufferHandle::operator=(&local_c8,&local_48);
          BufferHandle::~BufferHandle(&local_48);
          BufferPoolReservation::~BufferPoolReservation(&local_78);
          if (local_128._M_head_impl != (FileBuffer *)0x0) {
            (*(local_128._M_head_impl)->_vptr_FileBuffer[1])();
          }
          local_128._M_head_impl = (FileBuffer *)0x0;
        }
        ::std::unique_lock<std::mutex>::~unique_lock(&local_118);
        BufferHandle::~BufferHandle(&local_c8);
        TempBufferPoolReservation::~TempBufferPoolReservation
                  ((TempBufferPoolReservation *)&local_60);
        if (local_120._M_head_impl != (FileBuffer *)0x0) {
          (*(local_120._M_head_impl)->_vptr_FileBuffer[1])();
        }
        val = local_f8 + 1;
      } while (val != local_e0);
    }
    BufferHandle::~BufferHandle(&local_b0);
  }
  return;
}

Assistant:

void StandardBufferManager::BatchRead(vector<shared_ptr<BlockHandle>> &handles, const map<block_id_t, idx_t> &load_map,
                                      block_id_t first_block, block_id_t last_block) {
	auto &block_manager = handles[0]->block_manager;
	idx_t block_count = NumericCast<idx_t>(last_block - first_block + 1);
#ifndef DUCKDB_ALTERNATIVE_VERIFY
	if (block_count == 1) {
		// prefetching with block_count == 1 has no performance impact since we can't batch reads
		// skip the prefetch in this case
		// we do it anyway if alternative_verify is on for extra testing
		return;
	}
#endif

	// allocate a buffer to hold the data of all of the blocks
	auto intermediate_buffer = Allocate(MemoryTag::BASE_TABLE, block_count * block_manager.GetBlockSize());
	// perform a batch read of the blocks into the buffer
	block_manager.ReadBlocks(intermediate_buffer.GetFileBuffer(), first_block, block_count);

	// the blocks are read - now we need to assign them to the individual blocks
	for (idx_t block_idx = 0; block_idx < block_count; block_idx++) {
		block_id_t block_id = first_block + NumericCast<block_id_t>(block_idx);
		auto entry = load_map.find(block_id);
		D_ASSERT(entry != load_map.end()); // if we allow gaps we might not return true here
		auto &handle = handles[entry->second];

		// reserve memory for the block
		idx_t required_memory = handle->GetMemoryUsage();
		unique_ptr<FileBuffer> reusable_buffer;
		auto reservation = EvictBlocksOrThrow(handle->GetMemoryTag(), required_memory, &reusable_buffer,
		                                      "failed to pin block of size %s%s",
		                                      StringUtil::BytesToHumanReadableString(required_memory));
		// now load the block from the buffer
		// note that we discard the buffer handle - we do not keep it around
		// the prefetching relies on the block handle being pinned again during the actual read before it is evicted
		BufferHandle buf;
		{
			auto lock = handle->GetLock();
			if (handle->GetState() == BlockState::BLOCK_LOADED) {
				// the block is loaded already by another thread - free up the reservation and continue
				reservation.Resize(0);
				continue;
			}
			auto block_ptr =
			    intermediate_buffer.GetFileBuffer().InternalBuffer() + block_idx * block_manager.GetBlockAllocSize();
			buf = handle->LoadFromBuffer(lock, block_ptr, std::move(reusable_buffer), std::move(reservation));
		}
	}
}